

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::SetOneofIndexBase
          (OneofGenerator *this,int index_base)

{
  mapped_type *this_00;
  int in_EDX;
  key_type local_50;
  string local_30;
  
  SimpleItoa_abi_cxx11_
            (&local_30,
             (protobuf *)
             (ulong)(uint)((int)((ulong)((long)this->descriptor_ -
                                        *(long *)(*(long *)(this->descriptor_ + 0x10) + 0x40)) >> 4)
                           * 0x55555555 - index_base),in_EDX);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"index","");
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->variables_,&local_50);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OneofGenerator::SetOneofIndexBase(int index_base) {
  int index = descriptor_->index() + index_base;
  // Flip the sign to mark it as a oneof.
  variables_["index"] = SimpleItoa(-index);
}